

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

State * __thiscall
despot::BaseTag::GetMMAP
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  int iVar1;
  int opp_00;
  const_reference ppTVar2;
  undefined8 uStack_28;
  int state_id;
  Coord opp;
  Coord rob;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  BaseTag *this_local;
  
  _opp = MostLikelyRobPosition(this,particles);
  uStack_28 = MostLikelyOpponentPosition(this,particles);
  iVar1 = Floor::GetIndex(&this->floor_,&opp);
  opp_00 = Floor::GetIndex(&this->floor_,(Coord *)&stack0xffffffffffffffd8);
  iVar1 = RobOppIndicesToStateIndex(this,iVar1,opp_00);
  ppTVar2 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                      (&this->states_,(long)iVar1);
  return &(*ppTVar2)->super_State;
}

Assistant:

const State* BaseTag::GetMMAP(const vector<State*>& particles) const {
	Coord rob = MostLikelyRobPosition(particles);
	Coord opp = MostLikelyOpponentPosition(particles);

	int state_id = RobOppIndicesToStateIndex(floor_.GetIndex(rob),
		floor_.GetIndex(opp));
	return states_[state_id];
}